

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted-usec-list.c
# Opt level: O3

lws_usec_t lws_sul_nonmonotonic_adjust(lws_context *ctx,int64_t step_us)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  lws_context_per_thread *plVar4;
  bool bVar5;
  lws_sorted_usec_list_t *sul;
  lws_dll2 *plVar6;
  long lVar7;
  
  uVar1 = ctx->count_threads;
  if (uVar1 != 0) {
    plVar4 = ctx->pt;
    uVar3 = 0;
    do {
      lVar7 = 0;
      bVar2 = true;
      do {
        bVar5 = bVar2;
        if (plVar4->pt_sul_owner[lVar7].count != 0) {
          plVar6 = (lws_dll2 *)(plVar4->pt_sul_owner + lVar7);
          while (plVar6 = plVar6->next, plVar6 != (lws_dll2 *)0x0) {
            plVar6[1].prev = (lws_dll2 *)((long)&(plVar6[1].prev)->prev + step_us);
          }
        }
        lVar7 = 1;
        bVar2 = false;
      } while (bVar5);
      plVar4 = plVar4 + 1;
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar1);
  }
  return 0;
}

Assistant:

lws_usec_t
lws_sul_nonmonotonic_adjust(struct lws_context *ctx, int64_t step_us)
{
	struct lws_context_per_thread *pt = &ctx->pt[0];
	int n, m;

	/*
	 * for each pt
	 */

	for (m = 0; m < ctx->count_threads; m++) {

		/*
		 * For each owning list...
		 */

		lws_pt_lock(pt, __func__);

		for (n = 0; n < LWS_COUNT_PT_SUL_OWNERS; n++) {

			if (!pt->pt_sul_owner[n].count)
				continue;

			/* ... and for every existing sul on a list... */

			lws_start_foreach_dll(struct lws_dll2 *, p,
					      lws_dll2_get_head(
							&pt->pt_sul_owner[n])) {
				lws_sorted_usec_list_t *sul = lws_container_of(
					       p, lws_sorted_usec_list_t, list);

				/*
				 * ... retrospectively step its ripe time by the
				 * step we will adjust the gettimeofday() clock
				 * with
				 */

				sul->us += step_us;

			} lws_end_foreach_dll(p);
		}

		lws_pt_unlock(pt);

		pt++;
	}

	return 0;
}